

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

BGZF * bgzf_open_ref(char *fn,char *mode)

{
  int iVar1;
  char local_1028 [8];
  char fai_file [4096];
  BGZF *fp;
  char *mode_local;
  char *fn_local;
  
  snprintf(local_1028,0x1000,"%s.fai",fn);
  iVar1 = access(local_1028,4);
  if ((iVar1 == 0) || (iVar1 = fai_build(fn), iVar1 == 0)) {
    fai_file._4088_8_ = bgzf_open(fn,mode);
    if ((BGZF *)fai_file._4088_8_ == (BGZF *)0x0) {
      perror(fn);
      fn_local = (char *)0x0;
    }
    else if (((*(int *)fai_file._4088_8_ << 1) >> 0x1e == 1) &&
            (iVar1 = bgzf_index_load((BGZF *)fai_file._4088_8_,fn,".gzi"), iVar1 < 0)) {
      fprintf(_stderr,"Unable to load .gzi index \'%s.gzi\'\n",fn);
      bgzf_close((BGZF *)fai_file._4088_8_);
      fn_local = (char *)0x0;
    }
    else {
      fn_local = (char *)fai_file._4088_8_;
    }
  }
  else {
    fn_local = (char *)0x0;
  }
  return (BGZF *)fn_local;
}

Assistant:

static BGZF *bgzf_open_ref(char *fn, char *mode) {
    BGZF *fp;
    char fai_file[PATH_MAX];

    snprintf(fai_file, PATH_MAX, "%s.fai", fn);
    if (access(fai_file, R_OK) != 0)
	if (fai_build(fn) != 0)
	    return NULL;

    if (!(fp = bgzf_open(fn, mode))) {
	perror(fn);
	return NULL;
    }

    if (fp->is_compressed == 1 && bgzf_index_load(fp, fn, ".gzi") < 0) {
	fprintf(stderr, "Unable to load .gzi index '%s.gzi'\n", fn);
	bgzf_close(fp);
	return NULL;
    }

    return fp;
}